

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_public.c
# Opt level: O0

nng_err nng_http_server_get_addr(nng_http_server *srv,nng_sockaddr *addr)

{
  size_t local_28;
  size_t size;
  nng_sockaddr *addr_local;
  nng_http_server *srv_local;
  
  local_28 = 0x88;
  if ((srv == (nng_http_server *)0x0) || (addr == (nng_sockaddr *)0x0)) {
    srv_local._4_4_ = NNG_EINVAL;
  }
  else {
    size = (size_t)addr;
    addr_local = &srv->addr;
    srv_local._4_4_ = nni_http_server_get(srv,"local-address",addr,&local_28,NNI_TYPE_SOCKADDR);
  }
  return srv_local._4_4_;
}

Assistant:

nng_err
nng_http_server_get_addr(nng_http_server *srv, nng_sockaddr *addr)
{
#ifdef NNG_SUPP_HTTP
	size_t size = sizeof(nng_sockaddr);
	if (srv == NULL || addr == NULL)
		return NNG_EINVAL;
	return (nni_http_server_get(
	    srv, NNG_OPT_LOCADDR, addr, &size, NNI_TYPE_SOCKADDR));
#else
	NNI_ARG_UNUSED(srv);
	NNI_ARG_UNUSED(addr);
	return (NNG_ENOTSUP);
#endif
}